

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmDoWhile(ExpressionContext *ctx,VmModule *module,ExprDoWhile *node)

{
  VmBlock *expr;
  VmModule *ctx_00;
  ExprBase **this;
  VmValue *pVVar1;
  VmValue *condition;
  VmBlock *local_38;
  VmBlock *exitBlock;
  VmBlock *condBlock;
  VmBlock *bodyBlock;
  ExprDoWhile *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  bodyBlock = (VmBlock *)node;
  node_local = (ExprDoWhile *)module;
  module_local = (VmModule *)ctx;
  condBlock = anon_unknown.dwarf_aa461::CreateBlock(module,(node->super_ExprBase).source,"do_body");
  exitBlock = anon_unknown.dwarf_aa461::CreateBlock
                        ((VmModule *)node_local,*(SynBase **)&(bodyBlock->super_VmValue).type,
                         "do_cond");
  local_38 = anon_unknown.dwarf_aa461::CreateBlock
                       ((VmModule *)node_local,*(SynBase **)&(bodyBlock->super_VmValue).type,
                        "do_exit");
  anon_unknown.dwarf_aa461::CreateJump
            ((VmModule *)node_local,*(SynBase **)&(bodyBlock->super_VmValue).type,
             &condBlock->super_VmValue);
  VmFunction::AddBlock(*(VmFunction **)&(node_local->super_ExprBase).listed,condBlock);
  node_local->body = (ExprBase *)condBlock;
  this = &node_local->condition;
  VmModule::LoopInfo::LoopInfo((LoopInfo *)&condition,local_38,exitBlock);
  SmallArray<VmModule::LoopInfo,_32U>::push_back
            ((SmallArray<VmModule::LoopInfo,_32U> *)this,(LoopInfo *)&condition);
  CompileVm((ExpressionContext *)module_local,(VmModule *)node_local,
            (ExprBase *)(bodyBlock->super_VmValue).comment.end);
  anon_unknown.dwarf_aa461::CreateJump
            ((VmModule *)node_local,*(SynBase **)&(bodyBlock->super_VmValue).type,
             &exitBlock->super_VmValue);
  VmFunction::AddBlock(*(VmFunction **)&(node_local->super_ExprBase).listed,exitBlock);
  node_local->body = (ExprBase *)exitBlock;
  pVVar1 = CompileVm((ExpressionContext *)module_local,(VmModule *)node_local,
                     *(ExprBase **)&(bodyBlock->super_VmValue).hasSideEffects);
  anon_unknown.dwarf_aa461::CreateJumpNotZero
            ((VmModule *)node_local,*(SynBase **)&(bodyBlock->super_VmValue).type,pVVar1,
             &condBlock->super_VmValue,&local_38->super_VmValue);
  VmFunction::AddBlock(*(VmFunction **)&(node_local->super_ExprBase).listed,local_38);
  node_local->body = (ExprBase *)local_38;
  SmallArray<VmModule::LoopInfo,_32U>::pop_back
            ((SmallArray<VmModule::LoopInfo,_32U> *)&node_local->condition);
  ctx_00 = module_local;
  expr = bodyBlock;
  pVVar1 = anon_unknown.dwarf_aa461::CreateVoid((VmModule *)node_local);
  pVVar1 = anon_unknown.dwarf_aa461::CheckType((ExpressionContext *)ctx_00,(ExprBase *)expr,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmDoWhile(ExpressionContext &ctx, VmModule *module, ExprDoWhile *node)
{
	VmBlock *bodyBlock = CreateBlock(module, node->source, "do_body");
	VmBlock *condBlock = CreateBlock(module, node->source, "do_cond");
	VmBlock *exitBlock = CreateBlock(module, node->source, "do_exit");

	CreateJump(module, node->source, bodyBlock);

	module->currentFunction->AddBlock(bodyBlock);
	module->currentBlock = bodyBlock;

	module->loopInfo.push_back(VmModule::LoopInfo(exitBlock, condBlock));

	CompileVm(ctx, module, node->body);

	CreateJump(module, node->source, condBlock);

	module->currentFunction->AddBlock(condBlock);
	module->currentBlock = condBlock;

	VmValue* condition = CompileVm(ctx, module, node->condition);

	CreateJumpNotZero(module, node->source, condition, bodyBlock, exitBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	module->loopInfo.pop_back();

	return CheckType(ctx, node, CreateVoid(module));
}